

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
::grow(SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
       *this,size_t MinSize)

{
  SmallVector<unsigned_int,_0U> *RHS;
  move_iterator<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>_*> __first;
  void *__ptr;
  ulong uVar1;
  pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *__result;
  ulong uVar2;
  long extraout_RDX;
  SmallVector<unsigned_int,_0U> *__size;
  long lVar3;
  SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
  *__ptr_00;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar1 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                 ).super_SmallVectorBase.Capacity + 2;
  uVar2 = uVar1 >> 1 | uVar1;
  uVar2 = uVar2 >> 2 | uVar2;
  uVar2 = uVar2 >> 4 | uVar2;
  uVar2 = uVar2 >> 8 | uVar2;
  uVar1 = (uVar1 >> 0x20 | uVar2 >> 0x10 | uVar2) + 1;
  if (uVar1 <= MinSize) {
    uVar1 = MinSize;
  }
  if (0xfffffffe < uVar1) {
    uVar1 = 0xffffffff;
  }
  __size = (SmallVector<unsigned_int,_0U> *)(uVar1 * 0x18);
  __result = (pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *)malloc((size_t)__size);
  if (__result == (pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *)0x0) {
    SmallVectorTemplateBase<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>,false>::grow
              ();
    if (__size != (SmallVector<unsigned_int,_0U> *)MinSize) {
      lVar3 = 8;
      do {
        RHS = (SmallVector<unsigned_int,_0U> *)
              ((long)&(__size->super_SmallVectorImpl<unsigned_int>).
                      super_SmallVectorTemplateBase<unsigned_int,_true>.
                      super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.
                      BeginX + lVar3);
        *(undefined4 *)(extraout_RDX + -8 + lVar3) = *(undefined4 *)((long)__size + lVar3 + -8);
        SmallVector<unsigned_int,_0U>::SmallVector
                  ((SmallVector<unsigned_int,_0U> *)(extraout_RDX + lVar3),RHS);
        lVar3 = lVar3 + 0x18;
      } while (RHS + 1 != (SmallVector<unsigned_int,_0U> *)MinSize);
    }
    return;
  }
  __first._M_current =
       (pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *)
       (this->
       super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
       ).super_SmallVectorBase.BeginX;
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>*>,std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>*>
            (__first,__first._M_current +
                     (this->
                     super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                     ).super_SmallVectorBase.Size,__result);
  __ptr_00 = (SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
              *)(this->
                super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                ).super_SmallVectorBase.BeginX;
  uVar2 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                 ).super_SmallVectorBase.Size;
  if (uVar2 != 0) {
    lVar3 = uVar2 * 0x18;
    do {
      __ptr = *(void **)((long)&__ptr_00[-1].
                                super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                                .super_SmallVectorBase.BeginX + lVar3);
      if ((void *)((long)&(__ptr_00->
                          super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                          ).super_SmallVectorBase.BeginX + lVar3) != __ptr) {
        free(__ptr);
      }
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != 0);
    __ptr_00 = (SmallVectorTemplateBase<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_false>
                *)(this->
                  super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                  ).super_SmallVectorBase.BeginX;
  }
  if (__ptr_00 != this + 1) {
    free(__ptr_00);
  }
  (this->
  super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
  ).super_SmallVectorBase.BeginX = __result;
  (this->
  super_SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
  ).super_SmallVectorBase.Capacity = (uint)uVar1;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}